

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9DeleteFunction(jx9_vm *pVm,char *zName)

{
  sxu32 nKeyLen;
  sxi32 sVar1;
  void *pvStack_20;
  int rc;
  jx9_user_func *pFunc;
  char *zName_local;
  jx9_vm *pVm_local;
  
  pvStack_20 = (void *)0x0;
  pFunc = (jx9_user_func *)zName;
  zName_local = (char *)pVm;
  nKeyLen = SyStrlen(zName);
  sVar1 = SyHashDeleteEntry(&pVm->hHostFunction,zName,nKeyLen,&stack0xffffffffffffffe0);
  if (sVar1 == 0) {
    SySetRelease((SySet *)((long)pvStack_20 + 0x28));
    SyMemBackendFree((SyMemBackend *)zName_local,*(void **)((long)pvStack_20 + 8));
    SyMemBackendPoolFree((SyMemBackend *)zName_local,pvStack_20);
  }
  return sVar1;
}

Assistant:

JX9_PRIVATE int jx9DeleteFunction(jx9_vm *pVm,const char *zName)
{
	jx9_user_func *pFunc = 0; /* cc warning */
	int rc;
	/* Perform the deletion */
	rc = SyHashDeleteEntry(&pVm->hHostFunction, (const void *)zName, SyStrlen(zName), (void **)&pFunc);
	if( rc == JX9_OK ){
		/* Release internal fields */
		SySetRelease(&pFunc->aAux);
		SyMemBackendFree(&pVm->sAllocator, (void *)SyStringData(&pFunc->sName));
		SyMemBackendPoolFree(&pVm->sAllocator, pFunc);
	}
	return rc;
}